

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O2

string * __thiscall
t_cpp_generator::namespace_close(string *__return_storage_ptr__,t_cpp_generator *this,string *ns)

{
  long lVar1;
  string local_50 [32];
  
  if (ns->_M_string_length == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)local_50);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"}",(allocator *)local_50);
    while( true ) {
      lVar1 = std::__cxx11::string::find((char *)ns,0x2fd4e8);
      if (lVar1 == -1) break;
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::substr((ulong)local_50,(ulong)ns);
      std::__cxx11::string::operator=((string *)ns,local_50);
      std::__cxx11::string::~string(local_50);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_cpp_generator::namespace_close(string ns) {
  if (ns.size() == 0) {
    return "";
  }
  string result = "}";
  string::size_type loc;
  while ((loc = ns.find(".")) != string::npos) {
    result += "}";
    ns = ns.substr(loc + 1);
  }
  result += " // namespace";
  return result;
}